

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O3

int dfsfast_r(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  Flow_Data_t *pFVar7;
  ulong uVar8;
  MinRegMan_t *pMVar9;
  uint uVar10;
  Vec_Ptr_t *pVVar11;
  long lVar12;
  ushort uVar13;
  uint uVar14;
  long lVar15;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  uVar5 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar5 == 8) goto LAB_004d9343;
  if (pManMR->fIsForward == 0) {
    pFVar7 = pManMR->pDataArray;
    uVar8 = (ulong)(uint)pObj->Id;
    uVar13 = *(ushort *)(pFVar7 + uVar8);
  }
  else {
    if (uVar5 == 3) {
LAB_004d9343:
      if (pPred != (Abc_Obj_t *)0x0) {
        return 1;
      }
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                    ,0x147,"int dfsfast_r(Abc_Obj_t *, Abc_Obj_t *)");
    }
    pFVar7 = pManMR->pDataArray;
    uVar8 = (ulong)(uint)pObj->Id;
    uVar13 = (ushort)*(uint *)(pFVar7 + uVar8);
    if ((pManMR->constraintMask & *(uint *)(pFVar7 + uVar8) & 0x90) != 0) goto LAB_004d9343;
  }
  *(ushort *)(pFVar7 + uVar8) = uVar13 | 2;
  pFVar7 = pManMR->pDataArray;
  uVar5 = pObj->Id;
  if ((undefined1  [24])((undefined1  [24])pFVar7[uVar5] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    if ((((undefined1  [24])((undefined1  [24])pFVar7[uVar5] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0) &&
        (*(uint *)&pFVar7[uVar5].field_0x10 >> 0x10 ==
         (*(uint *)&pFVar7[uVar5].field_0x10 & 0xffff) + 1)) &&
       (iVar6 = dfsfast_e(pObj,pObj), iVar6 != 0)) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) | 4;
LAB_004d9401:
      FSETPRED(pObj,pPred);
LAB_004d940c:
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffd;
      return 1;
    }
  }
  else {
    pAVar2 = pFVar7[uVar5].field_1.pred;
    if ((((pAVar2 != (Abc_Obj_t *)0x0) &&
         ((undefined1  [24])((undefined1  [24])pFVar7[(uint)pAVar2->Id] & (undefined1  [24])0x1) ==
          (undefined1  [24])0x0)) &&
        ((uint)*(ushort *)&pFVar7[uVar5].field_0x12 ==
         *(ushort *)&pFVar7[(uint)pAVar2->Id].field_0x10 + 1)) &&
       (iVar6 = dfsfast_e(pAVar2,pAVar2), iVar6 != 0)) goto LAB_004d9401;
  }
  pMVar9 = pManMR;
  if (pManMR->fIsForward == 0) {
    uVar8 = (ulong)(uint)pObj->Id;
  }
  else {
    iVar6 = (pObj->vFanins).nSize;
    if (0 < iVar6) {
      lVar15 = 0;
      do {
        pAVar2 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar15]];
        pFVar7 = pMVar9->pDataArray;
        if ((((undefined1  [24])((undefined1  [24])pFVar7[(uint)pAVar2->Id] & (undefined1  [24])0x2)
              == (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar7[(uint)pObj->Id].field_0x12 ==
             *(ushort *)&pFVar7[(uint)pAVar2->Id].field_0x12 + 1)) &&
           ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8)) {
          iVar6 = dfsfast_r(pAVar2,pPred);
          if (iVar6 != 0) goto LAB_004d940c;
          iVar6 = (pObj->vFanins).nSize;
          pMVar9 = pManMR;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar6);
    }
    uVar8 = (ulong)(uint)pObj->Id;
    if ((pMVar9->maxDelay != 0) && (0 < pMVar9->vTimeEdges[uVar8].nSize)) {
      pVVar11 = pMVar9->vTimeEdges + uVar8;
      lVar15 = 0;
      do {
        pFVar7 = pMVar9->pDataArray;
        uVar5 = ((Abc_Obj_t *)pVVar11->pArray[lVar15])->Id;
        if (((undefined1  [24])((undefined1  [24])pFVar7[uVar5] & (undefined1  [24])0x2) ==
             (undefined1  [24])0x0) &&
           ((uint)*(ushort *)&pFVar7[uVar8].field_0x12 == *(ushort *)&pFVar7[uVar5].field_0x12 + 1))
        {
          iVar6 = dfsfast_r((Abc_Obj_t *)pVVar11->pArray[lVar15],pPred);
          if (iVar6 != 0) goto LAB_004d940c;
          uVar8 = (ulong)(uint)pObj->Id;
          pMVar9 = pManMR;
        }
        lVar15 = lVar15 + 1;
        pVVar11 = pMVar9->vTimeEdges + uVar8;
      } while (lVar15 < pMVar9->vTimeEdges[uVar8].nSize);
    }
  }
  *(ushort *)(pMVar9->pDataArray + uVar8) = *(ushort *)(pMVar9->pDataArray + uVar8) & 0xfffd;
  pFVar7 = pManMR->pDataArray;
  uVar5 = pObj->Id;
  uVar1 = *(uint *)&pFVar7[uVar5].field_0x10;
  if ((undefined1  [24])((undefined1  [24])pFVar7[uVar5] & (undefined1  [24])0x4) ==
      (undefined1  [24])0x0) {
    uVar14 = uVar1 & 0xffff;
    if (uVar14 == 0) {
      uVar10 = 30000;
      goto LAB_004d95a6;
    }
  }
  else {
    uVar10 = 30000;
    if ((pFVar7[uVar5].field_1.pred == (Abc_Obj_t *)0x0) ||
       (uVar14 = (uint)*(ushort *)&pFVar7[(uint)(pFVar7[uVar5].field_1.pred)->Id].field_0x10,
       *(ushort *)&pFVar7[(uint)(pFVar7[uVar5].field_1.pred)->Id].field_0x10 == 0))
    goto LAB_004d95a6;
  }
  uVar10 = 30000;
  if (uVar14 < 30000) {
    uVar10 = uVar14;
  }
LAB_004d95a6:
  if (pManMR->fIsForward != 0) {
    lVar15 = (long)(pObj->vFanins).nSize;
    if (0 < lVar15) {
      lVar12 = 0;
      do {
        pvVar3 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
        if ((((*(uint *)((long)pvVar3 + 0x14) & 0xf) != 8) &&
            (0xffff < *(uint *)&pFVar7[*(uint *)((long)pvVar3 + 0x10)].field_0x10)) &&
           (uVar14 = *(uint *)&pFVar7[*(uint *)((long)pvVar3 + 0x10)].field_0x10 >> 0x10,
           uVar14 <= uVar10)) {
          uVar10 = uVar14;
        }
        lVar12 = lVar12 + 1;
      } while (lVar15 != lVar12);
    }
    if (pManMR->maxDelay != 0) {
      lVar15 = (long)pManMR->vTimeEdges[uVar5].nSize;
      if (0 < lVar15) {
        lVar12 = 0;
        do {
          uVar14 = *(uint *)&pFVar7[*(uint *)((long)pManMR->vTimeEdges[uVar5].pArray[lVar12] + 0x10)
                                   ].field_0x10 >> 0x10;
          if (uVar10 < uVar14) {
            uVar14 = uVar10;
          }
          if (0xffff < *(uint *)&pFVar7[*(uint *)((long)pManMR->vTimeEdges[uVar5].pArray[lVar12] +
                                                 0x10)].field_0x10) {
            uVar10 = uVar14;
          }
          lVar12 = lVar12 + 1;
        } while (lVar15 != lVar12);
      }
    }
  }
  uVar8 = (ulong)(uVar10 + 1);
  if (0x752e < uVar10) {
    uVar8 = 0;
  }
  *(uint *)&pFVar7[uVar5].field_0x10 = uVar1 & 0xffff | (int)uVar8 << 0x10;
  pMVar9 = pManMR;
  if ((int)uVar8 < pManMR->vSinkDistHist->nSize) {
    piVar4 = pManMR->vSinkDistHist->pArray;
    piVar4[uVar1 >> 0x10] = piVar4[uVar1 >> 0x10] + -1;
    piVar4[uVar8] = piVar4[uVar8] + 1;
    if (piVar4[uVar1 >> 0x10] != 0) {
      return 0;
    }
    pMVar9->fSinkDistTerminate = 1;
    return 0;
  }
  __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                ,0x1fb,"void dfsfast_r_retreat(Abc_Obj_t *)");
}

Assistant:

int dfsfast_r( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext, *pOldPred;

  if (pManMR->fSinkDistTerminate) return 0;

#ifdef DEBUG_VISITED
  printf("(%dr=%d) ", Abc_ObjId(pObj), FDATA(pObj)->r_dist);
#endif  

  // have we reached the sink?
  if (Abc_ObjIsLatch(pObj) ||
      (pManMR->fIsForward && Abc_ObjIsPo(pObj)) || 
      (pManMR->fIsForward && FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask)) {
    assert(pPred);
    return 1;
  }

  FSET(pObj, VISITED_R);

  if (FTEST(pObj, FLOW)) {

    pOldPred = FGETPRED(pObj);
    if (pOldPred && 
        !FTEST(pOldPred, VISITED_E) &&
        FDIST(pObj, r, pOldPred, e) &&
        dfsfast_e(pOldPred, pOldPred)) {

      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("fr");
#endif
      goto found;
    }
    
  } else {

    if (!FTEST(pObj, VISITED_E) &&
        FDIST(pObj, r, pObj, e) &&
        dfsfast_e(pObj, pObj)) {

      FSET(pObj, FLOW);
      FSETPRED(pObj, pPred);

#ifdef DEBUG_PRINT_FLOWS
      printf("f");
#endif
      goto found;
    }
  }
 
  // 2. reverse edges (forward retiming only)
  if (pManMR->fIsForward) {
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, r, pNext, r) &&
          !Abc_ObjIsLatch(pNext) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }
  
  // 3. timing edges (forward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_R) &&
            FDIST(pObj, r, pNext, r) &&
            dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  FUNSET(pObj, VISITED_R);
  dfsfast_r_retreat(pObj);
  return 0;

 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif
  FUNSET(pObj, VISITED_R);
  return 1;
}